

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_h_predictor_32x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint8_t *dst_00;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i v;
  __m256i local_60 [2];
  
  auVar1 = *(undefined1 (*) [32])left;
  auVar2 = vpunpcklbw_avx2(auVar1,auVar1);
  local_60[0] = (__m256i)vpunpcklbw_avx2(auVar2,auVar2);
  h_predictor_32x8line(local_60,dst,stride);
  dst_00 = dst + stride * 4;
  local_60[0] = (__m256i)vpunpckhbw_avx2(auVar2,auVar2);
  h_predictor_32x8line(local_60,dst_00,stride);
  auVar1 = vpunpckhbw_avx2(auVar1,auVar1);
  local_60[0] = (__m256i)vpunpcklbw_avx2(auVar1,auVar1);
  h_predictor_32x8line(local_60,dst_00 + stride * 4,stride);
  local_60[0] = (__m256i)vpunpckhbw_avx2(auVar1,auVar1);
  h_predictor_32x8line(local_60,dst_00 + stride * 4 + stride * 4,stride);
  return;
}

Assistant:

void aom_h_predictor_32x32_avx2(uint8_t *dst, ptrdiff_t stride,
                                const uint8_t *above, const uint8_t *left) {
  (void)above;
  const __m256i left_col = _mm256_loadu_si256((__m256i const *)left);

  __m256i u = _mm256_unpacklo_epi8(left_col, left_col);

  __m256i v = _mm256_unpacklo_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
  dst += stride << 2;

  v = _mm256_unpackhi_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
  dst += stride << 2;

  u = _mm256_unpackhi_epi8(left_col, left_col);

  v = _mm256_unpacklo_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
  dst += stride << 2;

  v = _mm256_unpackhi_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
}